

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_unittest_main.cc
# Opt level: O2

void gflags::anon_unknown_5::Test_ReadFlagsFromStringDeathTest_HelpMatch::Run(void)

{
  char *pcVar1;
  allocator local_39;
  FlagSaver fs;
  string local_30;
  
  FlagSaver::FlagSaver(&fs);
  fprintf(_stderr,"Running test %s/%s\n","ReadFlagsFromStringDeathTest","HelpMatch");
  g_called_exit = '\0';
  gflags_exitfunc = CalledExit;
  std::__cxx11::string::string((string *)&local_30,"-helpmatch=base",&local_39);
  pcVar1 = GetArgv0();
  ReadFlagsFromString(&local_30,pcVar1,true);
  std::__cxx11::string::~string((string *)&local_30);
  gflags_exitfunc = exit;
  if (g_called_exit != '\0') {
    FlagSaver::~FlagSaver(&fs);
    return;
  }
  fprintf(_stderr,"Function didn\'t die (%s): %s\n","",
          "ReadFlagsFromString(\"-helpmatch=base\", GetArgv0(), true)");
  exit(1);
}

Assistant:

TEST(ReadFlagsFromStringDeathTest, HelpMatch) {
  EXPECT_DEATH(ReadFlagsFromString("-helpmatch=base", GetArgv0(), true),
               "");
}